

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          bool need_transpose)

{
  ulong uVar1;
  SPIRType *pSVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  string local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  result;
  string buffer_name;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,base);
  flattened_access_chain_offset_abi_cxx11_
            (&result,this,pSVar2,indices,count,offset,0x10,(bool *)0x0,(uint32_t *)0x0,
             (uint32_t *)0x0,false);
  pSVar2 = Compiler::expression_type(&this->super_Compiler,base);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&buffer_name,this,(ulong)(pSVar2->super_IVariant).self.id,1);
  if (need_transpose) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (1 < target_type->vecsize) {
      type_to_glsl_constructor_abi_cxx11_(&local_98,this,target_type);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    iVar5 = 0;
    for (uVar4 = 0; uVar4 < target_type->vecsize; uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar3 = target_type->width >> 3;
      uVar1 = (ulong)(result.second + iVar5) / (ulong)uVar3;
      if ((result.second + iVar5) % uVar3 != 0) {
        __assert_fail("component_offset % (target_type.width / 8) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x21a3,
                      "std::string spirv_cross::CompilerGLSL::flattened_access_chain_vector(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                     );
      }
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::to_string(&local_98,(uint)(uVar1 >> 2));
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      vector_swizzle(1,(uint)uVar1 & 3);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar5 = iVar5 + matrix_stride;
    }
    if (1 < target_type->vecsize) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    uVar4 = target_type->width >> 3;
    uVar1 = (ulong)result.second / (ulong)uVar4;
    if (result.second % uVar4 != 0) {
      __assert_fail("result.second % (target_type.width / 8) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x21b8,
                    "std::string spirv_cross::CompilerGLSL::flattened_access_chain_vector(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                   );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::to_string(&local_98,(uint)(uVar1 >> 2));
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    vector_swizzle(target_type->vecsize,(uint)uVar1 & 3);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&buffer_name);
  ::std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_vector(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	auto result = flattened_access_chain_offset(expression_type(base), indices, count, offset, 16);

	auto buffer_name = to_name(expression_type(base).self);

	if (need_transpose)
	{
		std::string expr;

		if (target_type.vecsize > 1)
		{
			expr += type_to_glsl_constructor(target_type);
			expr += "(";
		}

		for (uint32_t i = 0; i < target_type.vecsize; ++i)
		{
			if (i != 0)
				expr += ", ";

			uint32_t component_offset = result.second + i * matrix_stride;

			assert(component_offset % (target_type.width / 8) == 0);
			uint32_t index = component_offset / (target_type.width / 8);

			expr += buffer_name;
			expr += "[";
			expr += result.first; // this is a series of N1 * k1 + N2 * k2 + ... that is either empty or ends with a +
			expr += convert_to_string(index / 4);
			expr += "]";

			expr += vector_swizzle(1, index % 4);
		}

		if (target_type.vecsize > 1)
		{
			expr += ")";
		}

		return expr;
	}
	else
	{
		assert(result.second % (target_type.width / 8) == 0);
		uint32_t index = result.second / (target_type.width / 8);

		std::string expr;

		expr += buffer_name;
		expr += "[";
		expr += result.first; // this is a series of N1 * k1 + N2 * k2 + ... that is either empty or ends with a +
		expr += convert_to_string(index / 4);
		expr += "]";

		expr += vector_swizzle(target_type.vecsize, index % 4);

		return expr;
	}
}